

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_measures.cc
# Opt level: O1

S1Angle S2::GetLength(S2ShapeIndex *index)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  S1Angle SVar3;
  double local_18;
  
  iVar1 = (*index->_vptr_S2ShapeIndex[2])();
  if (iVar1 < 1) {
    local_18 = 0.0;
  }
  else {
    local_18 = 0.0;
    uVar2 = 0;
    do {
      iVar1 = (*index->_vptr_S2ShapeIndex[3])(index,(ulong)uVar2);
      if ((S2Shape *)CONCAT44(extraout_var,iVar1) != (S2Shape *)0x0) {
        SVar3 = GetLength((S2Shape *)CONCAT44(extraout_var,iVar1));
        local_18 = local_18 + SVar3.radians_;
      }
      uVar2 = uVar2 + 1;
      iVar1 = (*index->_vptr_S2ShapeIndex[2])(index);
    } while ((int)uVar2 < iVar1);
  }
  return (S1Angle)local_18;
}

Assistant:

S1Angle GetLength(const S2ShapeIndex& index) {
  S1Angle length;
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    S2Shape* shape = index.shape(i);
    if (shape) length += S2::GetLength(*shape);
  }
  return length;
}